

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O0

ssize_t amqp_tcp_socket_send(void *base,void *buf,size_t len,int flags)

{
  int iVar1;
  uint in_ECX;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  int flagz;
  ssize_t res;
  amqp_tcp_socket_t *self;
  int local_3c;
  ssize_t local_38;
  ssize_t local_8;
  
  if (*(int *)(in_RDI + 8) == -1) {
    local_8 = -0x11;
  }
  else {
    local_3c = 0x4000;
    if ((in_ECX & 1) != 0) {
      local_3c = 0xc000;
    }
    do {
      local_38 = send(*(int *)(in_RDI + 8),in_RSI,in_RDX,local_3c);
      if (-1 < local_38) {
        *(undefined4 *)(in_RDI + 0xc) = 0;
        goto LAB_00117717;
      }
      iVar1 = amqp_os_socket_error();
      *(int *)(in_RDI + 0xc) = iVar1;
    } while (*(int *)(in_RDI + 0xc) == 4);
    if (*(int *)(in_RDI + 0xc) == 0xb) {
      local_38 = -0x1302;
    }
    else {
      local_38 = -9;
    }
LAB_00117717:
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

static ssize_t amqp_tcp_socket_send(void *base, const void *buf, size_t len,
                                    int flags) {
  struct amqp_tcp_socket_t *self = (struct amqp_tcp_socket_t *)base;
  ssize_t res;
  int flagz = 0;

  if (-1 == self->sockfd) {
    return AMQP_STATUS_SOCKET_CLOSED;
  }

#ifdef MSG_NOSIGNAL
  flagz |= MSG_NOSIGNAL;
#endif

#if defined(MSG_MORE)
  if (flags & AMQP_SF_MORE) {
    flagz |= MSG_MORE;
  }
/* Cygwin defines TCP_NOPUSH, but trying to use it will return not
 * implemented. Disable it here. */
#elif defined(TCP_NOPUSH) && !defined(__CYGWIN__)
  if (flags & AMQP_SF_MORE && !(self->state & AMQP_SF_MORE)) {
    int one = 1;
    res = setsockopt(self->sockfd, IPPROTO_TCP, TCP_NOPUSH, &one, sizeof(one));
    if (0 != res) {
      self->internal_error = res;
      return AMQP_STATUS_SOCKET_ERROR;
    }
    self->state |= AMQP_SF_MORE;
  } else if (!(flags & AMQP_SF_MORE) && self->state & AMQP_SF_MORE) {
    int zero = 0;
    res =
        setsockopt(self->sockfd, IPPROTO_TCP, TCP_NOPUSH, &zero, sizeof(&zero));
    if (0 != res) {
      self->internal_error = res;
      res = AMQP_STATUS_SOCKET_ERROR;
    } else {
      self->state &= ~AMQP_SF_MORE;
    }
  }
#endif

start:
#ifdef _WIN32
  res = send(self->sockfd, buf, (int)len, flagz);
#else
  res = send(self->sockfd, buf, len, flagz);
#endif

  if (res < 0) {
    self->internal_error = amqp_os_socket_error();
    switch (self->internal_error) {
      case EINTR:
        goto start;
#ifdef _WIN32
      case WSAEWOULDBLOCK:
#else
      case EWOULDBLOCK:
#endif
#if defined(EAGAIN) && EAGAIN != EWOULDBLOCK
      case EAGAIN:
#endif
        res = AMQP_PRIVATE_STATUS_SOCKET_NEEDWRITE;
        break;
      default:
        res = AMQP_STATUS_SOCKET_ERROR;
    }
  } else {
    self->internal_error = 0;
  }

  return res;
}